

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

stbtt_uint32 stbtt__find_table(stbtt_uint8 *data,stbtt_uint32 fontstart,char *tag)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = *(ushort *)(data + (ulong)fontstart + 4) << 8 |
          *(ushort *)(data + (ulong)fontstart + 4) >> 8;
  if (uVar1 != 0) {
    uVar3 = (ulong)uVar1;
    uVar2 = fontstart + 0xc;
    do {
      if (((((uint)data[uVar2] == (int)*tag) && ((uint)data[(ulong)uVar2 + 1] == (int)tag[1])) &&
          ((uint)data[(ulong)uVar2 + 2] == (int)tag[2])) &&
         ((uint)data[(ulong)uVar2 + 3] == (int)tag[3])) {
        uVar2 = *(uint *)(data + (ulong)uVar2 + 8);
        return uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      }
      uVar2 = uVar2 + 0x10;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return 0;
}

Assistant:

static stbtt_uint32 stbtt__find_table(stbtt_uint8 *data, stbtt_uint32 fontstart, const char *tag)
{
   stbtt_int32 num_tables = ttUSHORT(data+fontstart+4);
   stbtt_uint32 tabledir = fontstart + 12;
   stbtt_int32 i;
   for (i=0; i < num_tables; ++i) {
      stbtt_uint32 loc = tabledir + 16*i;
      if (stbtt_tag(data+loc+0, tag))
         return ttULONG(data+loc+8);
   }
   return 0;
}